

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void SHA256_Transform(SHA256_CTX *c,uchar *data)

{
  int iVar1;
  size_t i;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint auStack_168 [8];
  uint local_148 [8];
  uint local_128 [64];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar3 = *(uint *)(data + lVar2 * 4);
    local_148[lVar2 + 8] =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  }
  for (lVar2 = 0x10; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    uVar3 = local_148[lVar2 + 6];
    uVar12 = auStack_168[lVar2 + 1];
    local_148[lVar2 + 8] =
         (uVar3 >> 10 ^ (uVar3 << 0xd | uVar3 >> 0x13) ^ (uVar3 << 0xf | uVar3 >> 0x11)) +
         local_148[lVar2 + 1] + auStack_168[lVar2] +
         (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7));
  }
  local_148[4] = (uint)*(undefined8 *)(c->h + 4);
  local_148[5] = (uint)((ulong)*(undefined8 *)(c->h + 4) >> 0x20);
  local_148[6] = (uint)*(undefined8 *)(c->h + 6);
  local_148[7] = (uint)((ulong)*(undefined8 *)(c->h + 6) >> 0x20);
  uVar3 = (local_148[6] ^ local_148[5]) & local_148[4] ^ local_148[6];
  iVar5 = ((local_148[4] << 7 | local_148[4] >> 0x19) ^
          (local_148[4] << 0x15 | local_148[4] >> 0xb) ^ (local_148[4] << 0x1a | local_148[4] >> 6))
          + local_148[7] + local_128[0];
  local_148[0] = (uint)*(undefined8 *)c->h;
  local_148[1] = (uint)((ulong)*(undefined8 *)c->h >> 0x20);
  local_148[3] = (uint)((ulong)*(undefined8 *)(c->h + 2) >> 0x20);
  local_148[3] = uVar3 + iVar5 + 0x428a2f98 + local_148[3];
  local_148[2] = (uint)*(undefined8 *)(c->h + 2);
  uVar12 = (local_148[3] * 0x80 | local_148[3] >> 0x19) ^
           (local_148[3] * 0x200000 | local_148[3] >> 0xb) ^
           (local_148[3] * 0x4000000 | local_148[3] >> 6);
  iVar1 = local_148[6] + local_128[1] +
          ((local_148[5] ^ local_148[4]) & local_148[3] ^ local_148[5]);
  uVar8 = iVar1 + uVar12 + local_148[2] + 0x71374491;
  uVar9 = iVar5 + uVar3 +
          ((local_148[0] << 10 | local_148[0] >> 0x16) ^
          (local_148[0] << 0x13 | local_148[0] >> 0xd) ^ (local_148[0] << 0x1e | local_148[0] >> 2))
          + 0x428a2f98 +
          (local_148[2] & local_148[1] | (local_148[2] | local_148[1]) & local_148[0]);
  uVar13 = (uVar8 * 0x80 | uVar8 >> 0x19) ^
           (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6);
  iVar5 = local_148[5] + local_128[2] + ((local_148[3] ^ local_148[4]) & uVar8 ^ local_148[4]);
  uVar4 = iVar5 + uVar13 + local_148[1] + 0xb5c0fbcf;
  uVar3 = (local_148[1] & local_148[0] | (local_148[1] | local_148[0]) & uVar9) +
          ((uVar9 * 0x400 | uVar9 >> 0x16) ^
          (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) +
          uVar12 + iVar1 + 0x71374491;
  uVar13 = (uVar9 & local_148[0] | (uVar9 | local_148[0]) & uVar3) +
           ((uVar3 * 0x400 | uVar3 >> 0x16) ^
           (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) +
           uVar13 + iVar5 + -0x4a3f0431;
  uVar12 = (uVar4 * 0x80 | uVar4 >> 0x19) ^
           (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6);
  iVar1 = local_148[4] + local_128[3] + ((uVar8 ^ local_148[3]) & uVar4 ^ local_148[3]);
  uVar6 = (uVar3 & uVar9 | (uVar3 | uVar9) & uVar13) +
          ((uVar13 * 0x400 | uVar13 >> 0x16) ^
          (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) +
          iVar1 + uVar12 + -0x164a245b;
  uVar10 = iVar1 + uVar12 + local_148[0] + 0xe9b5dba5;
  iVar1 = local_148[3] + local_128[4] + ((uVar4 ^ uVar8) & uVar10 ^ uVar8) +
          ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) + 0x3956c25b;
  uVar9 = uVar9 + iVar1;
  uVar7 = (uVar13 & uVar3 | (uVar13 | uVar3) & uVar6) +
          ((uVar6 * 0x400 | uVar6 >> 0x16) ^
          (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar1;
  iVar1 = uVar8 + local_128[5] + ((uVar10 ^ uVar4) & uVar9 ^ uVar4) +
          ((uVar9 * 0x80 | uVar9 >> 0x19) ^
          (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) + 0x59f111f1;
  uVar3 = uVar3 + iVar1;
  uVar12 = (uVar6 & uVar13 | (uVar6 | uVar13) & uVar7) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar1;
  iVar1 = ((uVar3 * 0x80 | uVar3 >> 0x19) ^
          (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6)) +
          uVar4 + local_128[6] + ((uVar9 ^ uVar10) & uVar3 ^ uVar10) + -0x6dc07d5c;
  uVar13 = uVar13 + iVar1;
  uVar4 = (uVar7 & uVar6 | (uVar7 | uVar6) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar1;
  iVar1 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar10 + local_128[7] + ((uVar3 ^ uVar9) & uVar13 ^ uVar9) + -0x54e3a12b;
  uVar6 = uVar6 + iVar1;
  uVar8 = (uVar12 & uVar7 | (uVar12 | uVar7) & uVar4) +
          ((uVar4 * 0x400 | uVar4 >> 0x16) ^
          (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar1;
  iVar1 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar9 + local_128[8] + ((uVar13 ^ uVar3) & uVar6 ^ uVar3) + -0x27f85568;
  uVar7 = uVar7 + iVar1;
  uVar9 = (uVar4 & uVar12 | (uVar4 | uVar12) & uVar8) +
          ((uVar8 * 0x400 | uVar8 >> 0x16) ^
          (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar1;
  iVar1 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar3 + local_128[9] + ((uVar6 ^ uVar13) & uVar7 ^ uVar13) + 0x12835b01;
  uVar12 = uVar12 + iVar1;
  uVar3 = (uVar8 & uVar4 | (uVar8 | uVar4) & uVar9) +
          ((uVar9 * 0x400 | uVar9 >> 0x16) ^
          (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar1;
  iVar1 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_128[10] + ((uVar7 ^ uVar6) & uVar12 ^ uVar6) + 0x243185be;
  uVar4 = uVar4 + iVar1;
  uVar13 = (uVar9 & uVar8 | (uVar9 | uVar8) & uVar3) +
           ((uVar3 * 0x400 | uVar3 >> 0x16) ^
           (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar1;
  iVar1 = ((uVar4 * 0x80 | uVar4 >> 0x19) ^
          (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) +
          uVar6 + local_128[0xb] + ((uVar12 ^ uVar7) & uVar4 ^ uVar7) + 0x550c7dc3;
  uVar8 = uVar8 + iVar1;
  uVar6 = (uVar3 & uVar9 | (uVar3 | uVar9) & uVar13) +
          ((uVar13 * 0x400 | uVar13 >> 0x16) ^
          (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar1;
  iVar1 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar7 + local_128[0xc] + ((uVar4 ^ uVar12) & uVar8 ^ uVar12) + 0x72be5d74;
  uVar9 = uVar9 + iVar1;
  uVar7 = (uVar13 & uVar3 | (uVar13 | uVar3) & uVar6) +
          ((uVar6 * 0x400 | uVar6 >> 0x16) ^
          (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar1;
  iVar1 = ((uVar9 * 0x80 | uVar9 >> 0x19) ^
          (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
          uVar12 + local_128[0xd] + ((uVar8 ^ uVar4) & uVar9 ^ uVar4) + -0x7f214e02;
  uVar3 = uVar3 + iVar1;
  uVar12 = (uVar6 & uVar13 | (uVar6 | uVar13) & uVar7) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar1;
  iVar1 = ((uVar3 * 0x80 | uVar3 >> 0x19) ^
          (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6)) +
          uVar4 + local_128[0xe] + ((uVar9 ^ uVar8) & uVar3 ^ uVar8) + -0x6423f959;
  uVar13 = uVar13 + iVar1;
  uVar4 = (uVar7 & uVar6 | (uVar7 | uVar6) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar1;
  iVar1 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar8 + local_128[0xf] + ((uVar3 ^ uVar9) & uVar13 ^ uVar9) + -0x3e640e8c;
  uVar6 = uVar6 + iVar1;
  uVar8 = (uVar12 & uVar7 | (uVar12 | uVar7) & uVar4) +
          ((uVar4 * 0x400 | uVar4 >> 0x16) ^
          (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar1;
  iVar1 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar9 + local_128[0x10] + ((uVar13 ^ uVar3) & uVar6 ^ uVar3) + -0x1b64963f;
  uVar7 = uVar7 + iVar1;
  uVar10 = (uVar4 & uVar12 | (uVar4 | uVar12) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar1;
  iVar1 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar3 + local_128[0x11] + ((uVar6 ^ uVar13) & uVar7 ^ uVar13) + -0x1041b87a;
  uVar12 = uVar12 + iVar1;
  uVar3 = (uVar8 & uVar4 | (uVar8 | uVar4) & uVar10) +
          ((uVar10 * 0x400 | uVar10 >> 0x16) ^
          (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar1;
  iVar1 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_128[0x12] + ((uVar7 ^ uVar6) & uVar12 ^ uVar6) + 0xfc19dc6;
  uVar4 = uVar4 + iVar1;
  uVar13 = (uVar10 & uVar8 | (uVar10 | uVar8) & uVar3) +
           ((uVar3 * 0x400 | uVar3 >> 0x16) ^
           (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar1;
  iVar1 = ((uVar4 * 0x80 | uVar4 >> 0x19) ^
          (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) +
          uVar6 + local_128[0x13] + ((uVar12 ^ uVar7) & uVar4 ^ uVar7) + 0x240ca1cc;
  uVar8 = uVar8 + iVar1;
  uVar6 = (uVar3 & uVar10 | (uVar3 | uVar10) & uVar13) +
          ((uVar13 * 0x400 | uVar13 >> 0x16) ^
          (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar1;
  iVar1 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar7 + local_128[0x14] + ((uVar4 ^ uVar12) & uVar8 ^ uVar12) + 0x2de92c6f;
  uVar10 = uVar10 + iVar1;
  uVar7 = (uVar13 & uVar3 | (uVar13 | uVar3) & uVar6) +
          ((uVar6 * 0x400 | uVar6 >> 0x16) ^
          (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar1;
  iVar1 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar12 + local_128[0x15] + ((uVar8 ^ uVar4) & uVar10 ^ uVar4) + 0x4a7484aa;
  uVar3 = uVar3 + iVar1;
  uVar12 = (uVar6 & uVar13 | (uVar6 | uVar13) & uVar7) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar1;
  iVar1 = ((uVar3 * 0x80 | uVar3 >> 0x19) ^
          (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6)) +
          uVar4 + local_128[0x16] + ((uVar10 ^ uVar8) & uVar3 ^ uVar8) + 0x5cb0a9dc;
  uVar13 = uVar13 + iVar1;
  uVar4 = (uVar7 & uVar6 | (uVar7 | uVar6) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar1;
  iVar1 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar8 + local_128[0x17] + ((uVar3 ^ uVar10) & uVar13 ^ uVar10) + 0x76f988da;
  uVar6 = uVar6 + iVar1;
  uVar9 = (uVar12 & uVar7 | (uVar12 | uVar7) & uVar4) +
          ((uVar4 * 0x400 | uVar4 >> 0x16) ^
          (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar1;
  iVar1 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar10 + local_128[0x18] + ((uVar13 ^ uVar3) & uVar6 ^ uVar3) + -0x67c1aeae;
  uVar7 = uVar7 + iVar1;
  uVar10 = (uVar4 & uVar12 | (uVar4 | uVar12) & uVar9) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar1;
  iVar1 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar3 + local_128[0x19] + ((uVar6 ^ uVar13) & uVar7 ^ uVar13) + -0x57ce3993;
  uVar12 = uVar12 + iVar1;
  uVar3 = (uVar9 & uVar4 | (uVar9 | uVar4) & uVar10) +
          ((uVar10 * 0x400 | uVar10 >> 0x16) ^
          (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar1;
  iVar1 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_128[0x1a] + ((uVar7 ^ uVar6) & uVar12 ^ uVar6) + -0x4ffcd838;
  uVar4 = uVar4 + iVar1;
  uVar13 = (uVar10 & uVar9 | (uVar10 | uVar9) & uVar3) +
           ((uVar3 * 0x400 | uVar3 >> 0x16) ^
           (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar1;
  iVar1 = ((uVar4 * 0x80 | uVar4 >> 0x19) ^
          (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) +
          uVar6 + local_128[0x1b] + ((uVar12 ^ uVar7) & uVar4 ^ uVar7) + -0x40a68039;
  uVar9 = uVar9 + iVar1;
  uVar6 = (uVar3 & uVar10 | (uVar3 | uVar10) & uVar13) +
          ((uVar13 * 0x400 | uVar13 >> 0x16) ^
          (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar1;
  iVar1 = ((uVar9 * 0x80 | uVar9 >> 0x19) ^
          (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
          uVar7 + local_128[0x1c] + ((uVar4 ^ uVar12) & uVar9 ^ uVar12) + -0x391ff40d;
  uVar10 = uVar10 + iVar1;
  uVar8 = (uVar13 & uVar3 | (uVar13 | uVar3) & uVar6) +
          ((uVar6 * 0x400 | uVar6 >> 0x16) ^
          (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar1;
  iVar1 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar12 + local_128[0x1d] + ((uVar9 ^ uVar4) & uVar10 ^ uVar4) + -0x2a586eb9;
  uVar3 = uVar3 + iVar1;
  uVar12 = (uVar6 & uVar13 | (uVar6 | uVar13) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar1;
  iVar1 = ((uVar3 * 0x80 | uVar3 >> 0x19) ^
          (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6)) +
          uVar4 + local_128[0x1e] + ((uVar10 ^ uVar9) & uVar3 ^ uVar9) + 0x6ca6351;
  uVar13 = uVar13 + iVar1;
  uVar4 = (uVar8 & uVar6 | (uVar8 | uVar6) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar1;
  iVar1 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar9 + local_128[0x1f] + ((uVar3 ^ uVar10) & uVar13 ^ uVar10) + 0x14292967;
  uVar6 = uVar6 + iVar1;
  uVar9 = (uVar12 & uVar8 | (uVar12 | uVar8) & uVar4) +
          ((uVar4 * 0x400 | uVar4 >> 0x16) ^
          (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar1;
  iVar1 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar10 + local_128[0x20] + ((uVar13 ^ uVar3) & uVar6 ^ uVar3) + 0x27b70a85;
  uVar8 = uVar8 + iVar1;
  uVar10 = (uVar4 & uVar12 | (uVar4 | uVar12) & uVar9) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar1;
  iVar1 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar3 + local_128[0x21] + ((uVar6 ^ uVar13) & uVar8 ^ uVar13) + 0x2e1b2138;
  uVar12 = uVar12 + iVar1;
  uVar3 = (uVar9 & uVar4 | (uVar9 | uVar4) & uVar10) +
          ((uVar10 * 0x400 | uVar10 >> 0x16) ^
          (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar1;
  iVar1 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_128[0x22] + ((uVar8 ^ uVar6) & uVar12 ^ uVar6) + 0x4d2c6dfc;
  uVar4 = uVar4 + iVar1;
  uVar13 = (uVar10 & uVar9 | (uVar10 | uVar9) & uVar3) +
           ((uVar3 * 0x400 | uVar3 >> 0x16) ^
           (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar1;
  iVar1 = ((uVar4 * 0x80 | uVar4 >> 0x19) ^
          (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) +
          uVar6 + local_128[0x23] + ((uVar12 ^ uVar8) & uVar4 ^ uVar8) + 0x53380d13;
  uVar9 = uVar9 + iVar1;
  uVar7 = (uVar3 & uVar10 | (uVar3 | uVar10) & uVar13) +
          ((uVar13 * 0x400 | uVar13 >> 0x16) ^
          (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar1;
  iVar1 = ((uVar9 * 0x80 | uVar9 >> 0x19) ^
          (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
          uVar8 + local_128[0x24] + ((uVar4 ^ uVar12) & uVar9 ^ uVar12) + 0x650a7354;
  uVar10 = uVar10 + iVar1;
  uVar8 = (uVar13 & uVar3 | (uVar13 | uVar3) & uVar7) +
          ((uVar7 * 0x400 | uVar7 >> 0x16) ^
          (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar1;
  iVar1 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar12 + local_128[0x25] + ((uVar9 ^ uVar4) & uVar10 ^ uVar4) + 0x766a0abb;
  uVar3 = uVar3 + iVar1;
  uVar12 = (uVar7 & uVar13 | (uVar7 | uVar13) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar1;
  iVar1 = ((uVar3 * 0x80 | uVar3 >> 0x19) ^
          (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6)) +
          uVar4 + local_128[0x26] + ((uVar10 ^ uVar9) & uVar3 ^ uVar9) + -0x7e3d36d2;
  uVar13 = uVar13 + iVar1;
  uVar4 = (uVar8 & uVar7 | (uVar8 | uVar7) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar1;
  iVar1 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar9 + local_128[0x27] + ((uVar3 ^ uVar10) & uVar13 ^ uVar10) + -0x6d8dd37b;
  uVar7 = uVar7 + iVar1;
  uVar9 = (uVar12 & uVar8 | (uVar12 | uVar8) & uVar4) +
          ((uVar4 * 0x400 | uVar4 >> 0x16) ^
          (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar1;
  iVar1 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar10 + local_128[0x28] + ((uVar13 ^ uVar3) & uVar7 ^ uVar3) + -0x5d40175f;
  uVar8 = uVar8 + iVar1;
  uVar10 = (uVar4 & uVar12 | (uVar4 | uVar12) & uVar9) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar1;
  iVar1 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar3 + local_128[0x29] + ((uVar7 ^ uVar13) & uVar8 ^ uVar13) + -0x57e599b5;
  uVar12 = uVar12 + iVar1;
  uVar3 = (uVar9 & uVar4 | (uVar9 | uVar4) & uVar10) +
          ((uVar10 * 0x400 | uVar10 >> 0x16) ^
          (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar1;
  iVar1 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_128[0x2a] + ((uVar8 ^ uVar7) & uVar12 ^ uVar7) + -0x3db47490;
  uVar4 = uVar4 + iVar1;
  uVar6 = (uVar10 & uVar9 | (uVar10 | uVar9) & uVar3) +
          ((uVar3 * 0x400 | uVar3 >> 0x16) ^
          (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar1;
  iVar1 = uVar7 + local_128[0x2b] + ((uVar12 ^ uVar8) & uVar4 ^ uVar8) +
          ((uVar4 * 0x80 | uVar4 >> 0x19) ^
          (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) + -0x3893ae5d;
  uVar9 = uVar9 + iVar1;
  uVar13 = (uVar3 & uVar10 | (uVar3 | uVar10) & uVar6) +
           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar1;
  iVar1 = ((uVar9 * 0x80 | uVar9 >> 0x19) ^
          (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
          uVar8 + local_128[0x2c] + ((uVar4 ^ uVar12) & uVar9 ^ uVar12) + -0x2e6d17e7;
  uVar10 = uVar10 + iVar1;
  uVar8 = (uVar6 & uVar3 | (uVar6 | uVar3) & uVar13) +
          ((uVar13 * 0x400 | uVar13 >> 0x16) ^
          (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar1;
  iVar1 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar12 + local_128[0x2d] + ((uVar9 ^ uVar4) & uVar10 ^ uVar4) + -0x2966f9dc;
  uVar3 = uVar3 + iVar1;
  uVar12 = (uVar13 & uVar6 | (uVar13 | uVar6) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar1;
  iVar1 = uVar4 + local_128[0x2e] + ((uVar10 ^ uVar9) & uVar3 ^ uVar9) +
          ((uVar3 * 0x80 | uVar3 >> 0x19) ^
          (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6)) + -0xbf1ca7b;
  uVar6 = uVar6 + iVar1;
  uVar7 = (uVar8 & uVar13 | (uVar8 | uVar13) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar1;
  iVar1 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar9 + local_128[0x2f] + ((uVar3 ^ uVar10) & uVar6 ^ uVar10) + 0x106aa070;
  uVar13 = uVar13 + iVar1;
  uVar9 = (uVar12 & uVar8 | (uVar12 | uVar8) & uVar7) +
          ((uVar7 * 0x400 | uVar7 >> 0x16) ^
          (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) + iVar1;
  iVar1 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar10 + local_128[0x30] + ((uVar6 ^ uVar3) & uVar13 ^ uVar3) + 0x19a4c116;
  uVar8 = uVar8 + iVar1;
  uVar10 = (uVar7 & uVar12 | (uVar7 | uVar12) & uVar9) +
           ((uVar9 * 0x400 | uVar9 >> 0x16) ^
           (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar1;
  iVar1 = uVar3 + local_128[0x31] + ((uVar13 ^ uVar6) & uVar8 ^ uVar6) +
          ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + 0x1e376c08;
  uVar12 = uVar12 + iVar1;
  uVar4 = (uVar9 & uVar7 | (uVar9 | uVar7) & uVar10) +
          ((uVar10 * 0x400 | uVar10 >> 0x16) ^
          (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar1;
  iVar1 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar6 + local_128[0x32] + ((uVar8 ^ uVar13) & uVar12 ^ uVar13) + 0x2748774c;
  uVar7 = uVar7 + iVar1;
  uVar6 = (uVar10 & uVar9 | (uVar10 | uVar9) & uVar4) +
          ((uVar4 * 0x400 | uVar4 >> 0x16) ^
          (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar1;
  iVar1 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar13 + local_128[0x33] + ((uVar12 ^ uVar8) & uVar7 ^ uVar8) + 0x34b0bcb5;
  uVar9 = uVar9 + iVar1;
  uVar13 = (uVar4 & uVar10 | (uVar4 | uVar10) & uVar6) +
           ((uVar6 * 0x400 | uVar6 >> 0x16) ^
           (uVar6 * 0x80000 | uVar6 >> 0xd) ^ (uVar6 * 0x40000000 | uVar6 >> 2)) + iVar1;
  iVar1 = ((uVar9 * 0x80 | uVar9 >> 0x19) ^
          (uVar9 * 0x200000 | uVar9 >> 0xb) ^ (uVar9 * 0x4000000 | uVar9 >> 6)) +
          uVar8 + local_128[0x34] + ((uVar7 ^ uVar12) & uVar9 ^ uVar12) + 0x391c0cb3;
  uVar10 = uVar10 + iVar1;
  uVar8 = (uVar6 & uVar4 | (uVar6 | uVar4) & uVar13) +
          ((uVar13 * 0x400 | uVar13 >> 0x16) ^
          (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar1;
  iVar1 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar12 + local_128[0x35] + ((uVar9 ^ uVar7) & uVar10 ^ uVar7) + 0x4ed8aa4a;
  uVar4 = uVar4 + iVar1;
  uVar11 = (uVar13 & uVar6 | (uVar13 | uVar6) & uVar8) +
           ((uVar8 * 0x400 | uVar8 >> 0x16) ^
           (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar1;
  iVar1 = ((uVar4 * 0x80 | uVar4 >> 0x19) ^
          (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6)) +
          uVar7 + local_128[0x36] + ((uVar10 ^ uVar9) & uVar4 ^ uVar9) + 0x5b9cca4f;
  uVar6 = uVar6 + iVar1;
  uVar12 = (uVar8 & uVar13 | (uVar8 | uVar13) & uVar11) +
           ((uVar11 * 0x400 | uVar11 >> 0x16) ^
           (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar1;
  iVar1 = ((uVar6 * 0x80 | uVar6 >> 0x19) ^
          (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) +
          uVar9 + local_128[0x37] + ((uVar4 ^ uVar10) & uVar6 ^ uVar10) + 0x682e6ff3;
  uVar13 = uVar13 + iVar1;
  uVar3 = (uVar11 & uVar8 | (uVar11 | uVar8) & uVar12) +
          ((uVar12 * 0x400 | uVar12 >> 0x16) ^
          (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar1;
  iVar1 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar10 + local_128[0x38] + ((uVar6 ^ uVar4) & uVar13 ^ uVar4) + 0x748f82ee;
  uVar8 = uVar8 + iVar1;
  local_148[7] = (uVar12 & uVar11 | (uVar12 | uVar11) & uVar3) +
                 ((uVar3 * 0x400 | uVar3 >> 0x16) ^
                 (uVar3 * 0x80000 | uVar3 >> 0xd) ^ (uVar3 * 0x40000000 | uVar3 >> 2)) + iVar1;
  iVar1 = ((uVar8 * 0x80 | uVar8 >> 0x19) ^
          (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) +
          uVar4 + local_128[0x39] + ((uVar13 ^ uVar6) & uVar8 ^ uVar6) + 0x78a5636f;
  uVar11 = uVar11 + iVar1;
  local_148[6] = (uVar3 & uVar12 | (uVar3 | uVar12) & local_148[7]) +
                 ((local_148[7] * 0x400 | local_148[7] >> 0x16) ^
                 (local_148[7] * 0x80000 | local_148[7] >> 0xd) ^
                 (local_148[7] * 0x40000000 | local_148[7] >> 2)) + iVar1;
  iVar1 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar6 + local_128[0x3a] + ((uVar8 ^ uVar13) & uVar11 ^ uVar13) + -0x7b3787ec;
  uVar12 = uVar12 + iVar1;
  local_148[5] = (local_148[7] & uVar3 | (local_148[7] | uVar3) & local_148[6]) +
                 ((local_148[6] * 0x400 | local_148[6] >> 0x16) ^
                 (local_148[6] * 0x80000 | local_148[6] >> 0xd) ^
                 (local_148[6] * 0x40000000 | local_148[6] >> 2)) + iVar1;
  iVar1 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_128[0x3b] + ((uVar11 ^ uVar8) & uVar12 ^ uVar8) + -0x7338fdf8;
  uVar3 = uVar3 + iVar1;
  uVar4 = (local_148[6] & local_148[7] | (local_148[6] | local_148[7]) & local_148[5]) +
          ((local_148[5] * 0x400 | local_148[5] >> 0x16) ^
          (local_148[5] * 0x80000 | local_148[5] >> 0xd) ^
          (local_148[5] * 0x40000000 | local_148[5] >> 2)) + iVar1;
  iVar1 = ((uVar3 * 0x80 | uVar3 >> 0x19) ^
          (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6)) +
          uVar8 + local_128[0x3c] + ((uVar12 ^ uVar11) & uVar3 ^ uVar11) + -0x6f410006;
  local_148[7] = local_148[7] + iVar1;
  local_148[3] = (local_148[5] & local_148[6] | (local_148[5] | local_148[6]) & uVar4) +
                 ((uVar4 * 0x400 | uVar4 >> 0x16) ^
                 (uVar4 * 0x80000 | uVar4 >> 0xd) ^ (uVar4 * 0x40000000 | uVar4 >> 2)) + iVar1;
  iVar1 = ((local_148[7] * 0x80 | local_148[7] >> 0x19) ^
          (local_148[7] * 0x200000 | local_148[7] >> 0xb) ^
          (local_148[7] * 0x4000000 | local_148[7] >> 6)) +
          uVar11 + local_128[0x3d] + ((uVar3 ^ uVar12) & local_148[7] ^ uVar12) + -0x5baf9315;
  local_148[6] = local_148[6] + iVar1;
  local_148[2] = (uVar4 & local_148[5] | (uVar4 | local_148[5]) & local_148[3]) +
                 ((local_148[3] * 0x400 | local_148[3] >> 0x16) ^
                 (local_148[3] * 0x80000 | local_148[3] >> 0xd) ^
                 (local_148[3] * 0x40000000 | local_148[3] >> 2)) + iVar1;
  iVar1 = uVar12 + local_128[0x3e] + ((local_148[7] ^ uVar3) & local_148[6] ^ uVar3) +
          ((local_148[6] * 0x80 | local_148[6] >> 0x19) ^
          (local_148[6] * 0x200000 | local_148[6] >> 0xb) ^
          (local_148[6] * 0x4000000 | local_148[6] >> 6)) + -0x41065c09;
  local_148[5] = local_148[5] + iVar1;
  local_148[1] = (local_148[3] & uVar4 | (local_148[3] | uVar4) & local_148[2]) +
                 ((local_148[2] * 0x400 | local_148[2] >> 0x16) ^
                 (local_148[2] * 0x80000 | local_148[2] >> 0xd) ^
                 (local_148[2] * 0x40000000 | local_148[2] >> 2)) + iVar1;
  iVar1 = uVar3 + local_128[0x3f] + ((local_148[6] ^ local_148[7]) & local_148[5] ^ local_148[7]) +
          ((local_148[5] * 0x80 | local_148[5] >> 0x19) ^
          (local_148[5] * 0x200000 | local_148[5] >> 0xb) ^
          (local_148[5] * 0x4000000 | local_148[5] >> 6)) + -0x398e870e;
  local_148[4] = uVar4 + iVar1;
  local_148[0] = (local_148[2] & local_148[3] | (local_148[2] | local_148[3]) & local_148[1]) +
                 ((local_148[1] * 0x400 | local_148[1] >> 0x16) ^
                 (local_148[1] * 0x80000 | local_148[1] >> 0xd) ^
                 (local_148[1] * 0x40000000 | local_148[1] >> 2)) + iVar1;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    c->h[lVar2] = c->h[lVar2] + local_148[lVar2];
  }
  return;
}

Assistant:

static void
SHA256_Transform(uint32_t * state, const unsigned char block[64])
{
	uint32_t W[64];
	uint32_t S[8];
	uint32_t t0, t1;
	int i;

	/* 1. Prepare message schedule W. */
	be32dec_vect(W, block, 64);
	for (i = 16; i < 64; i++)
		W[i] = s1(W[i - 2]) + W[i - 7] + s0(W[i - 15]) + W[i - 16];

	/* 2. Initialize working variables. */
	memcpy(S, state, 32);

	/* 3. Mix. */
	RNDr(S, W, 0, 0x428a2f98);
	RNDr(S, W, 1, 0x71374491);
	RNDr(S, W, 2, 0xb5c0fbcf);
	RNDr(S, W, 3, 0xe9b5dba5);
	RNDr(S, W, 4, 0x3956c25b);
	RNDr(S, W, 5, 0x59f111f1);
	RNDr(S, W, 6, 0x923f82a4);
	RNDr(S, W, 7, 0xab1c5ed5);
	RNDr(S, W, 8, 0xd807aa98);
	RNDr(S, W, 9, 0x12835b01);
	RNDr(S, W, 10, 0x243185be);
	RNDr(S, W, 11, 0x550c7dc3);
	RNDr(S, W, 12, 0x72be5d74);
	RNDr(S, W, 13, 0x80deb1fe);
	RNDr(S, W, 14, 0x9bdc06a7);
	RNDr(S, W, 15, 0xc19bf174);
	RNDr(S, W, 16, 0xe49b69c1);
	RNDr(S, W, 17, 0xefbe4786);
	RNDr(S, W, 18, 0x0fc19dc6);
	RNDr(S, W, 19, 0x240ca1cc);
	RNDr(S, W, 20, 0x2de92c6f);
	RNDr(S, W, 21, 0x4a7484aa);
	RNDr(S, W, 22, 0x5cb0a9dc);
	RNDr(S, W, 23, 0x76f988da);
	RNDr(S, W, 24, 0x983e5152);
	RNDr(S, W, 25, 0xa831c66d);
	RNDr(S, W, 26, 0xb00327c8);
	RNDr(S, W, 27, 0xbf597fc7);
	RNDr(S, W, 28, 0xc6e00bf3);
	RNDr(S, W, 29, 0xd5a79147);
	RNDr(S, W, 30, 0x06ca6351);
	RNDr(S, W, 31, 0x14292967);
	RNDr(S, W, 32, 0x27b70a85);
	RNDr(S, W, 33, 0x2e1b2138);
	RNDr(S, W, 34, 0x4d2c6dfc);
	RNDr(S, W, 35, 0x53380d13);
	RNDr(S, W, 36, 0x650a7354);
	RNDr(S, W, 37, 0x766a0abb);
	RNDr(S, W, 38, 0x81c2c92e);
	RNDr(S, W, 39, 0x92722c85);
	RNDr(S, W, 40, 0xa2bfe8a1);
	RNDr(S, W, 41, 0xa81a664b);
	RNDr(S, W, 42, 0xc24b8b70);
	RNDr(S, W, 43, 0xc76c51a3);
	RNDr(S, W, 44, 0xd192e819);
	RNDr(S, W, 45, 0xd6990624);
	RNDr(S, W, 46, 0xf40e3585);
	RNDr(S, W, 47, 0x106aa070);
	RNDr(S, W, 48, 0x19a4c116);
	RNDr(S, W, 49, 0x1e376c08);
	RNDr(S, W, 50, 0x2748774c);
	RNDr(S, W, 51, 0x34b0bcb5);
	RNDr(S, W, 52, 0x391c0cb3);
	RNDr(S, W, 53, 0x4ed8aa4a);
	RNDr(S, W, 54, 0x5b9cca4f);
	RNDr(S, W, 55, 0x682e6ff3);
	RNDr(S, W, 56, 0x748f82ee);
	RNDr(S, W, 57, 0x78a5636f);
	RNDr(S, W, 58, 0x84c87814);
	RNDr(S, W, 59, 0x8cc70208);
	RNDr(S, W, 60, 0x90befffa);
	RNDr(S, W, 61, 0xa4506ceb);
	RNDr(S, W, 62, 0xbef9a3f7);
	RNDr(S, W, 63, 0xc67178f2);

	/* 4. Mix local working variables into global state */
	for (i = 0; i < 8; i++)
		state[i] += S[i];

	/* Clean the stack. */
	memset(W, 0, 256);
	memset(S, 0, 32);
	t0 = t1 = 0;
}